

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O0

string * libcellml::versionString_abi_cxx11_(void)

{
  string *in_RDI;
  
  std::__cxx11::string::string
            ((string *)in_RDI,(string *)LIBCELLML_LIBRARY_VERSION_STRING_abi_cxx11_);
  return in_RDI;
}

Assistant:

std::string versionString()
{
    return LIBCELLML_LIBRARY_VERSION_STRING;
}